

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O3

uint32_t zhash_str_hash(void *_a)

{
  uint32_t uVar1;
  char *pcVar2;
  char cVar3;
  
  if (_a == (void *)0x0) {
    __assert_fail("_a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zhash.c"
                  ,0x219,"uint32_t zhash_str_hash(const void *)");
  }
  pcVar2 = *_a;
  cVar3 = *pcVar2;
  if (cVar3 == '\0') {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      pcVar2 = pcVar2 + 1;
      uVar1 = ((int)uVar1 >> 0x17) + uVar1 * 0x80 + (int)cVar3;
      cVar3 = *pcVar2;
    } while (cVar3 != '\0');
  }
  return uVar1;
}

Assistant:

uint32_t zhash_str_hash(const void *_a)
{
    assert(_a != NULL);

    char *a = * (char**)_a;

    int32_t hash = 0;
    while (*a != 0) {
        hash = (hash << 7) + (hash >> 23);
        hash += *a;
        a++;
    }

    return (uint32_t) hash;
}